

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O2

char * vstrdupf(char *fmt,__va_list_tag *args)

{
  int iVar1;
  char *__s;
  char *__format;
  va_list args2;
  
  args2[0].reg_save_area = args->reg_save_area;
  args2[0].gp_offset = args->gp_offset;
  args2[0].fp_offset = args->fp_offset;
  args2[0].overflow_arg_area = args->overflow_arg_area;
  __format = "";
  if (fmt != (char *)0x0) {
    __format = fmt;
  }
  iVar1 = vsnprintf((char *)0x0,0,__format,args2);
  __s = (char *)malloc((long)(iVar1 + 2));
  if (__s != (char *)0x0) {
    vsprintf(__s,__format,args);
    return __s;
  }
  perror("malloc error");
  exit(1);
}

Assistant:

static char *
vstrdupf (const char *fmt, va_list args) {
    char *str;
    int size;
    va_list args2;
    va_copy(args2, args);
    if (!fmt)
        fmt = "";
    size = vsnprintf(NULL, 0, fmt, args2) + 2;
    str = malloc(size);
    if (!str) {
        perror("malloc error");
        exit(1);
    }
    vsprintf(str, fmt, args);
    va_end(args2);
    return str;
}